

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

uint32_t duckdb::ParquetCrypto::WriteData
                   (TProtocol *oprot,const_data_ptr_t buffer,uint32_t buffer_size,string *key,
                   EncryptionUtil *encryption_util_p)

{
  undefined8 this;
  uint32_t uVar1;
  TCompactProtocolFactoryT<duckdb::EncryptionTransport> tproto_factory;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> eprot;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> local_68;
  undefined1 local_58 [32];
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  local_68.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR__TProtocolFactory_027de270;
  local_68.
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  make_shared<duckdb::EncryptionTransport,duckdb_apache::thrift::protocol::TProtocol&,std::__cxx11::string_const&,duckdb::EncryptionUtil_const&>
            ((TProtocol *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oprot,
             (EncryptionUtil *)key);
  local_38 = (element_type *)local_58._0_8_;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
  local_58._0_8_ = (EncryptionTransport *)0x0;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::EncryptionTransport>::
  getProtocol((TCompactProtocolFactoryT<duckdb::EncryptionTransport> *)(local_58 + 0x10),&local_68);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  ::std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                *)local_58,
               (__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                *)(local_58._16_8_ + 8));
  this = local_58._0_8_;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  (*((TTransport *)this)->_vptr_TTransport[9])(this,buffer,(ulong)buffer_size);
  uVar1 = EncryptionTransport::Finalize((EncryptionTransport *)this);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x18));
  duckdb_apache::thrift::protocol::TProtocolFactory::~TProtocolFactory
            ((TProtocolFactory *)&local_68);
  return uVar1;
}

Assistant:

uint32_t ParquetCrypto::WriteData(TProtocol &oprot, const const_data_ptr_t buffer, const uint32_t buffer_size,
                                  const string &key, const EncryptionUtil &encryption_util_p) {
	// FIXME: we know the size upfront so we could do a streaming write instead of this
	// Create encryption protocol
	TCompactProtocolFactoryT<EncryptionTransport> tproto_factory;
	auto eprot = tproto_factory.getProtocol(std::make_shared<EncryptionTransport>(oprot, key, encryption_util_p));
	auto &etrans = reinterpret_cast<EncryptionTransport &>(*eprot->getTransport());

	// Write the data in memory
	etrans.write(buffer, buffer_size);

	// Encrypt and write to oprot
	return etrans.Finalize();
}